

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkrequestfactory.cpp
# Opt level: O3

QUrl __thiscall
QNetworkRequestFactoryPrivate::requestUrl
          (QNetworkRequestFactoryPrivate *this,QString *path,QUrlQuery *query)

{
  qsizetype *pqVar1;
  int *piVar2;
  char cVar3;
  ParsingMode PVar4;
  QUrlQuery *in_RCX;
  QList<std::pair<QString,_QString>_> *__range2;
  QString *pQVar5;
  pair<QString,_QString> *item;
  type *key;
  QString *pQVar6;
  long in_FS_OFFSET;
  bool bVar7;
  QUrlQuery pathQueryItems;
  QUrlQuery resultQuery;
  QUrlQuery providedQuery;
  QUrl providedPath;
  QArrayDataPointer<std::pair<QString,_QString>_> local_b8;
  undefined1 *local_98;
  undefined1 *local_90;
  undefined4 local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined1 *local_78;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  undefined1 *local_58;
  undefined1 *local_48;
  QUrl local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_40.d = (QUrlPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  if (query == (QUrlQuery *)0x0) {
    QUrl::QUrl(&local_40);
  }
  else {
    QUrl::QUrl(&local_40,(QString *)query,TolerantMode);
  }
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  if (in_RCX == (QUrlQuery *)0x0) {
    QUrlQuery::QUrlQuery((QUrlQuery *)&local_48);
  }
  else {
    QUrlQuery::QUrlQuery((QUrlQuery *)&local_48,in_RCX);
  }
  QUrl::scheme();
  bVar7 = true;
  if (local_58 == (undefined1 *)0x0) {
    QUrl::host(&local_88,&local_40,0x7f00000);
    bVar7 = local_78 != (undefined1 *)0x0;
    piVar2 = (int *)CONCAT44(uStack_84,local_88);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT44(uStack_84,local_88),2,0x10);
      }
    }
  }
  piVar2 = (int *)CONCAT44(uStack_64,local_68);
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT44(uStack_64,local_68),2,0x10);
    }
  }
  if (bVar7) {
    lcQrequestfactory();
    if (((byte)lcQrequestfactory::category.field_2.bools.enabledWarning._q_value._M_base._M_i & 1)
        != 0) {
      requestUrl();
    }
  }
  *(undefined1 **)this = &DAT_aaaaaaaaaaaaaaaa;
  pqVar1 = &(path->d).size;
  QUrl::QUrl((QUrl *)this,(QUrl *)pqVar1);
  local_90 = &DAT_aaaaaaaaaaaaaaaa;
  QUrlQuery::QUrlQuery((QUrlQuery *)&local_90,(QUrlQuery *)&local_48);
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  local_68 = 0xaaaaaaaa;
  uStack_64 = 0xaaaaaaaa;
  uStack_60 = 0xaaaaaaaa;
  uStack_5c = 0xaaaaaaaa;
  QUrl::path(&local_68,pqVar1,0x7f00000);
  QUrl::setUserName((QString *)this,(int)path + 0x38);
  QUrl::setPassword((QString *)this,(int)path + 0x50);
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  local_88 = 0xaaaaaaaa;
  uStack_84 = 0xaaaaaaaa;
  uStack_80 = 0xaaaaaaaa;
  uStack_7c = 0xaaaaaaaa;
  QUrl::path(&local_88,&local_40,0x7f00000);
  local_98 = &DAT_aaaaaaaaaaaaaaaa;
  QUrlQuery::QUrlQuery((QUrlQuery *)&local_98,&local_40);
  cVar3 = QUrlQuery::isEmpty();
  if (cVar3 == '\0') {
    local_b8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_b8.d._0_4_ = 0xaaaaaaaa;
    local_b8.d._4_4_ = 0xaaaaaaaa;
    local_b8.ptr._0_4_ = 0xaaaaaaaa;
    local_b8.ptr._4_4_ = 0xaaaaaaaa;
    QUrlQuery::queryItems(&local_b8,&local_98,0x1f00000);
    if ((undefined1 *)local_b8.size != (undefined1 *)0x0) {
      pQVar6 = (QString *)CONCAT44(local_b8.ptr._4_4_,local_b8.ptr._0_4_);
      pQVar5 = pQVar6 + local_b8.size * 0x30;
      do {
        QUrlQuery::addQueryItem((QString *)&local_90,pQVar6);
        pQVar6 = pQVar6 + 0x30;
      } while (pQVar6 != pQVar5);
    }
    QArrayDataPointer<std::pair<QString,_QString>_>::~QArrayDataPointer(&local_b8);
  }
  cVar3 = QUrlQuery::isEmpty();
  if (cVar3 == '\0') {
    local_b8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_b8.d._0_4_ = 0xaaaaaaaa;
    local_b8.d._4_4_ = 0xaaaaaaaa;
    local_b8.ptr._0_4_ = 0xaaaaaaaa;
    local_b8.ptr._4_4_ = 0xaaaaaaaa;
    QUrlQuery::queryItems(&local_b8,&path[4].d.ptr,0x1f00000);
    if ((undefined1 *)local_b8.size != (undefined1 *)0x0) {
      pQVar6 = (QString *)CONCAT44(local_b8.ptr._4_4_,local_b8.ptr._0_4_);
      pQVar5 = pQVar6 + local_b8.size * 0x30;
      do {
        QUrlQuery::addQueryItem((QString *)&local_90,pQVar6);
        pQVar6 = pQVar6 + 0x30;
      } while (pQVar6 != pQVar5);
    }
    QArrayDataPointer<std::pair<QString,_QString>_>::~QArrayDataPointer(&local_b8);
  }
  cVar3 = QUrlQuery::isEmpty();
  if (cVar3 == '\0') {
    QUrl::setQuery((QUrlQuery *)this);
  }
  if (local_78 == (undefined1 *)0x0) goto LAB_0021c105;
  cVar3 = QString::endsWith((QChar)(char16_t)&local_68,0x2f);
  if (cVar3 == '\0') {
LAB_0021c0a7:
    cVar3 = QString::startsWith((QChar)(char16_t)&local_88,0x2f);
    if (cVar3 == '\0') {
      cVar3 = QString::endsWith((QChar)(char16_t)&local_68,0x2f);
      if (cVar3 == '\0') {
        QString::append((QChar)(char16_t)&local_68);
      }
    }
  }
  else {
    cVar3 = QString::startsWith((QChar)(char16_t)&local_88,0x2f);
    if (cVar3 == '\0') goto LAB_0021c0a7;
    QString::chop((longlong)&local_68);
  }
  PVar4 = QString::append((QString *)&local_68);
  QUrl::setPath((QString *)this,PVar4);
LAB_0021c105:
  QUrlQuery::~QUrlQuery((QUrlQuery *)&local_98);
  piVar2 = (int *)CONCAT44(uStack_84,local_88);
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT44(uStack_84,local_88),2,0x10);
    }
  }
  piVar2 = (int *)CONCAT44(uStack_64,local_68);
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT44(uStack_64,local_68),2,0x10);
    }
  }
  QUrlQuery::~QUrlQuery((QUrlQuery *)&local_90);
  QUrlQuery::~QUrlQuery((QUrlQuery *)&local_48);
  QUrl::~QUrl(&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (QUrl)(QUrlPrivate *)this;
  }
  __stack_chk_fail();
}

Assistant:

QUrl QNetworkRequestFactoryPrivate::requestUrl(const QString *path,
                                             const QUrlQuery *query) const
{
    const QUrl providedPath = path ? QUrl(*path) : QUrl{};
    const QUrlQuery providedQuery = query ? *query : QUrlQuery();

    if (!providedPath.scheme().isEmpty() || !providedPath.host().isEmpty()) {
        qCWarning(lcQrequestfactory, "The provided path %ls may only contain path and query item "
                  "components, and other parts will be ignored. Set the baseUrl instead",
                  qUtf16Printable(providedPath.toDisplayString()));
    }

    QUrl resultUrl = baseUrl;
    QUrlQuery resultQuery(providedQuery);
    QString basePath = baseUrl.path();

    resultUrl.setUserName(userName);
    resultUrl.setPassword(password);

    // Separate the path and query parameters components on the application-provided path
    const QString requestPath{providedPath.path()};
    const QUrlQuery pathQueryItems{providedPath};

    if (!pathQueryItems.isEmpty()) {
        // Add any query items provided as part of the path
        const auto items = pathQueryItems.queryItems(QUrl::ComponentFormattingOption::FullyEncoded);
        for (const auto &[key, value]: items)
            resultQuery.addQueryItem(key, value);
    }

    if (!queryParameters.isEmpty()) {
        // Add any query items set to this factory
        const QList<std::pair<QString,QString>> items =
                queryParameters.queryItems(QUrl::ComponentFormattingOption::FullyEncoded);
        for (const auto &item: items)
            resultQuery.addQueryItem(item.first, item.second);
    }

    if (!resultQuery.isEmpty())
        resultUrl.setQuery(resultQuery);

    if (requestPath.isEmpty())
        return resultUrl;

    // Ensure that the "base path" (the path that may be present
    // in the baseUrl), and the request path are joined with one '/'
    // If both have it, remove one, if neither has it, add one
    if (basePath.endsWith(u'/') && requestPath.startsWith(u'/'))
        basePath.chop(1);
    else if (!requestPath.startsWith(u'/') && !basePath.endsWith(u'/'))
        basePath.append(u'/');

    resultUrl.setPath(basePath.append(requestPath));
    return resultUrl;
}